

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_string::data(xpath_string *this,xpath_allocator *alloc)

{
  size_t sVar1;
  char_t *pcVar2;
  undefined8 *in_RDI;
  char_t *data_;
  size_t length_;
  xpath_allocator *in_stack_ffffffffffffffc8;
  char_t *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    sVar1 = strlength((char_t *)0x141afb);
    pcVar2 = duplicate_string(in_stack_ffffffffffffffd8,(size_t)in_RDI,in_stack_ffffffffffffffc8);
    if (pcVar2 == (char_t *)0x0) {
      return (char_t *)0x0;
    }
    *in_RDI = pcVar2;
    *(undefined1 *)(in_RDI + 1) = 1;
    in_RDI[2] = sVar1;
  }
  return (char_t *)*in_RDI;
}

Assistant:

char_t* data(xpath_allocator* alloc)
		{
			// make private heap copy
			if (!_uses_heap)
			{
				size_t length_ = strlength(_buffer);
				const char_t* data_ = duplicate_string(_buffer, length_, alloc);

				if (!data_) return 0;

				_buffer = data_;
				_uses_heap = true;
				_length_heap = length_;
			}

			return const_cast<char_t*>(_buffer);
		}